

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O2

int set_no_block(socket_t fd)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(fd,3,0);
  iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
  return iVar2;
}

Assistant:

int set_no_block(socket_t fd)
{
#if defined(__linux__) || defined(__APPLE__)
    int flags = fcntl(fd, F_GETFL, 0);
    return fcntl(fd, F_SETFL, flags | O_NONBLOCK);
#else
    u_long argp = 1;
    return ::ioctlsocket(fd, FIONBIO, &argp);
#endif
}